

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

NetAliasSymbol *
slang::ast::NetAliasSymbol::fromSyntax
          (ASTContext *parentContext,NetAliasSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  group_type_pointer pgVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  size_t __n;
  value_type_pointer pbVar18;
  undefined8 uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  int iVar36;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar37;
  NetAliasSymbol *this;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  char *pcVar43;
  ulong uVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  ASTContext context;
  long local_228;
  string_view local_220;
  Compilation *local_210;
  ulong local_208;
  ulong local_200;
  NetType *local_1f8;
  uint64_t local_1f0;
  char *local_1e8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  IdentifierNameSyntax *local_1c0;
  char *local_1b8;
  ulong local_1b0;
  value_type_pointer local_1a8;
  long local_1a0;
  char *local_198;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_190 [2];
  locator local_150;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  uchar uStack_129;
  undefined1 local_128 [136];
  allocator_type local_a0;
  undefined1 local_98 [24];
  value_type_pointer pbStack_80;
  ulong local_78;
  ulong local_70;
  ASTContext local_68;
  
  local_128._128_8_ = local_128;
  local_98._0_8_ = 0x3f;
  local_98._8_8_ = 1;
  stack0xffffffffffffff78 = ZEXT816(0x9543d0);
  local_78 = 0;
  local_70 = 0;
  local_1e0 = implicitNets;
  local_a0.storage = (Storage *)local_128._128_8_;
  ASTContext::resetFlags(&local_68,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  local_210 = (local_68.scope.ptr)->compilation;
  local_1f8 = Scope::getDefaultNetType(local_68.scope.ptr);
  local_208 = (syntax->nets).elements._M_extent._M_extent_value + 1;
  if (1 < local_208) {
    local_208 = local_208 >> 1;
    uVar42 = 0;
    do {
      ppSVar37 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->nets).elements._M_ptr + uVar42 * 2));
      if (local_1f8->netKind != Unknown) {
        local_190[0].data_ = (pointer)local_190[0].firstElement;
        local_190[0].len = 0;
        local_190[0].cap = 5;
        Expression::findPotentiallyImplicitNets(*ppSVar37,&local_68,local_190);
        if (local_190[0].len != 0) {
          local_1b8 = (char *)((long)local_190[0].data_ + local_190[0].len * 8);
          pcVar43 = (char *)local_190[0].data_;
          local_200 = uVar42;
          do {
            local_1c0 = *(IdentifierNameSyntax **)pcVar43;
            local_220 = parsing::Token::valueText(&local_1c0->identifier);
            local_1e8 = pcVar43;
            local_1f0 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&local_a0,&local_220);
            uVar41 = local_1f0 >> (local_98[0] & 0x3f);
            uVar19 = local_98._16_8_;
            lVar40 = (local_1f0 & 0xff) * 4;
            uVar47 = (&UNK_009584ac)[lVar40];
            uVar48 = (&UNK_009584ad)[lVar40];
            uVar49 = (&UNK_009584ae)[lVar40];
            uVar50 = (&UNK_009584af)[lVar40];
            local_1a8 = pbStack_80;
            __n = local_220._M_len;
            local_198 = local_220._M_str;
            uVar39 = (ulong)((uint)local_1f0 & 7);
            local_1d0 = local_98._8_8_;
            uVar44 = 0;
            uVar51 = uVar47;
            uVar52 = uVar48;
            uVar53 = uVar49;
            uVar54 = uVar50;
            uVar55 = uVar47;
            uVar56 = uVar48;
            uVar57 = uVar49;
            uVar58 = uVar50;
            uVar59 = uVar47;
            uVar60 = uVar48;
            uVar61 = uVar49;
            uVar62 = uVar50;
            local_1b0 = uVar41;
            do {
              pbVar18 = local_1a8;
              local_1a0 = uVar41 * 0x10;
              pgVar1 = (group_type_pointer)(uVar19 + uVar41 * 0x10);
              auVar46[0] = -(pgVar1->m[0].n == uVar47);
              auVar46[1] = -(pgVar1->m[1].n == uVar48);
              auVar46[2] = -(pgVar1->m[2].n == uVar49);
              auVar46[3] = -(pgVar1->m[3].n == uVar50);
              auVar46[4] = -(pgVar1->m[4].n == uVar51);
              auVar46[5] = -(pgVar1->m[5].n == uVar52);
              auVar46[6] = -(pgVar1->m[6].n == uVar53);
              auVar46[7] = -(pgVar1->m[7].n == uVar54);
              auVar46[8] = -(pgVar1->m[8].n == uVar55);
              auVar46[9] = -(pgVar1->m[9].n == uVar56);
              auVar46[10] = -(pgVar1->m[10].n == uVar57);
              auVar46[0xb] = -(pgVar1->m[0xb].n == uVar58);
              auVar46[0xc] = -(pgVar1->m[0xc].n == uVar59);
              auVar46[0xd] = -(pgVar1->m[0xd].n == uVar60);
              auVar46[0xe] = -(pgVar1->m[0xe].n == uVar61);
              auVar46[0xf] = -(pgVar1->m[0xf].n == uVar62);
              local_1c8 = uVar41;
              uVar20 = uVar47;
              uVar21 = uVar48;
              uVar22 = uVar49;
              uVar23 = uVar50;
              uVar24 = uVar51;
              uVar25 = uVar52;
              uVar26 = uVar53;
              uVar27 = uVar54;
              uVar28 = uVar55;
              uVar29 = uVar56;
              uVar30 = uVar57;
              uVar31 = uVar58;
              uVar32 = uVar59;
              uVar33 = uVar60;
              uVar34 = uVar61;
              uVar35 = uVar62;
              uVar2 = local_138;
              uVar3 = uStack_137;
              uVar4 = uStack_136;
              uVar5 = uStack_135;
              uVar6 = uStack_134;
              uVar7 = uStack_133;
              uVar8 = uStack_132;
              uVar9 = uStack_131;
              uVar10 = uStack_130;
              uVar11 = uStack_12f;
              uVar12 = uStack_12e;
              uVar13 = uStack_12d;
              uVar14 = uStack_12c;
              uVar15 = uStack_12b;
              uVar16 = uStack_12a;
              uVar17 = uStack_129;
              for (uVar38 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
                  uStack_129 = uVar35, uStack_12a = uVar34, uStack_12b = uVar33, uStack_12c = uVar32
                  , uStack_12d = uVar31, uStack_12e = uVar30, uStack_12f = uVar29,
                  uStack_130 = uVar28, uStack_131 = uVar27, uStack_132 = uVar26, uStack_133 = uVar25
                  , uStack_134 = uVar24, uStack_135 = uVar23, uStack_136 = uVar22,
                  uStack_137 = uVar21, local_138 = uVar20, uVar38 != 0; uVar38 = uVar38 - 1 & uVar38
                  ) {
                iVar36 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> iVar36 & 1) == 0; iVar36 = iVar36 + 1) {
                  }
                }
                bVar45 = __n == *(size_t *)
                                 ((long)&pbVar18[uVar41 * 0xf]._M_len + (ulong)(uint)(iVar36 << 4));
                local_228 = (long)&pbVar18[uVar41 * 0xf]._M_len + (ulong)(uint)(iVar36 << 4);
                local_1d8 = uVar39;
                if (bVar45 && __n != 0) {
                  iVar36 = bcmp(local_198,*(void **)(local_228 + 8),__n);
                  bVar45 = iVar36 == 0;
                  uVar47 = local_138;
                  uVar48 = uStack_137;
                  uVar49 = uStack_136;
                  uVar50 = uStack_135;
                  uVar51 = uStack_134;
                  uVar52 = uStack_133;
                  uVar53 = uStack_132;
                  uVar54 = uStack_131;
                  uVar55 = uStack_130;
                  uVar56 = uStack_12f;
                  uVar57 = uStack_12e;
                  uVar58 = uStack_12d;
                  uVar59 = uStack_12c;
                  uVar60 = uStack_12b;
                  uVar61 = uStack_12a;
                  uVar62 = uStack_129;
                }
                uVar42 = local_200;
                if (bVar45) goto LAB_007ad7f9;
                uVar39 = local_1d8;
                uVar20 = local_138;
                uVar21 = uStack_137;
                uVar22 = uStack_136;
                uVar23 = uStack_135;
                uVar24 = uStack_134;
                uVar25 = uStack_133;
                uVar26 = uStack_132;
                uVar27 = uStack_131;
                uVar28 = uStack_130;
                uVar29 = uStack_12f;
                uVar30 = uStack_12e;
                uVar31 = uStack_12d;
                uVar32 = uStack_12c;
                uVar33 = uStack_12b;
                uVar34 = uStack_12a;
                uVar35 = uStack_129;
                uVar2 = local_138;
                uVar3 = uStack_137;
                uVar4 = uStack_136;
                uVar5 = uStack_135;
                uVar6 = uStack_134;
                uVar7 = uStack_133;
                uVar8 = uStack_132;
                uVar9 = uStack_131;
                uVar10 = uStack_130;
                uVar11 = uStack_12f;
                uVar12 = uStack_12e;
                uVar13 = uStack_12d;
                uVar14 = uStack_12c;
                uVar15 = uStack_12b;
                uVar16 = uStack_12a;
                uVar17 = uStack_129;
              }
              local_138 = uVar2;
              uStack_137 = uVar3;
              uStack_136 = uVar4;
              uStack_135 = uVar5;
              uStack_134 = uVar6;
              uStack_133 = uVar7;
              uStack_132 = uVar8;
              uStack_131 = uVar9;
              uStack_130 = uVar10;
              uStack_12f = uVar11;
              uStack_12e = uVar12;
              uStack_12d = uVar13;
              uStack_12c = uVar14;
              uStack_12b = uVar15;
              uStack_12a = uVar16;
              uStack_129 = uVar17;
              if ((((slot_type *)uVar19)[local_1a0 + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar39]) == 0) break;
              lVar40 = local_1c8 + uVar44;
              uVar44 = uVar44 + 1;
              uVar41 = lVar40 + 1U & local_1d0;
            } while (uVar44 <= local_1d0);
            local_228 = 0;
LAB_007ad7f9:
            pcVar43 = local_1e8;
            if (local_228 == 0) {
              if (local_70 < local_78) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_150,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_a0,(arrays_type *)local_98,local_1b0,local_1f0,&local_220);
                local_70 = local_70 + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_150,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_a0,local_1f0,&local_220);
              }
              local_150.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                             NetSymbol::createImplicit(local_210,local_1c0,local_1f8);
              SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1e0,
                         (Symbol **)&local_150);
            }
            pcVar43 = pcVar43 + 8;
          } while (pcVar43 != local_1b8);
        }
        if (local_190[0].data_ != (pointer)local_190[0].firstElement) {
          operator_delete(local_190[0].data_);
        }
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 != local_208);
  }
  local_190[0].data_ = (pointer)parsing::Token::location(&syntax->keyword);
  this = BumpAllocator::emplace<slang::ast::NetAliasSymbol,slang::SourceLocation>
                   (&local_210->super_BumpAllocator,(SourceLocation *)local_190);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,local_68.scope.ptr,syntax_00);
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_(local_a0,(table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)local_98);
  return this;
}

Assistant:

NetAliasSymbol& NetAliasSymbol::fromSyntax(const ASTContext& parentContext,
                                           const syntax::NetAliasSyntax& syntax,
                                           SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> seenNames;
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& comp = context.getCompilation();
    auto& netType = context.scope->getDefaultNetType();

    for (auto expr : syntax.nets) {
        // If not explicitly disabled check for implicit nets.
        if (!netType.isError()) {
            SmallVector<const IdentifierNameSyntax*> implicitNetNames;
            Expression::findPotentiallyImplicitNets(*expr, context, implicitNetNames);

            for (auto ins : implicitNetNames) {
                if (seenNames.emplace(ins->identifier.valueText()).second)
                    implicitNets.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
            }
        }
    }

    auto result = comp.emplace<NetAliasSymbol>(syntax.keyword.location());
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);
    return *result;
}